

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O3

ComponentHandle<C,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<C,C_const&>(EntityManager *this,Id id,C *args)

{
  ulong *puVar1;
  ComponentHandle<C,_entityx::EntityManager> CVar2;
  Family FVar3;
  ComponentHandle<C,_entityx::EntityManager> component;
  Entity local_38;
  ComponentHandle<C,_entityx::EntityManager> local_28;
  
  FVar3 = Component<C>::family();
  accomodate_component<C>(this);
  if (FVar3 < 0x40) {
    puVar1 = (ulong *)(*(long *)(this + 0x48) + (id.id_ & 0xffffffff) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)FVar3 & 0x3f);
    local_38.manager_ = this;
    local_38.id_.id_ = id.id_;
    local_28.manager_ = this;
    local_28.id_.id_ = id.id_;
    EventManager::
    emit<entityx::ComponentAddedEvent<C>,entityx::Entity,entityx::ComponentHandle<C,entityx::EntityManager>&>
              (*(EventManager **)(this + 0x10),&local_38,&local_28);
    CVar2.id_.id_ = local_28.id_.id_;
    CVar2.manager_ = local_28.manager_;
    return CVar2;
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",FVar3,0x40);
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }